

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Projection::Write(Projection *this,IMkvWriter *writer)

{
  bool bVar1;
  uint64_t size;
  
  size = PayloadSize(this);
  if (size == 0) {
    return true;
  }
  bVar1 = WriteEbmlMasterElement(writer,0x7670,size);
  if ((((bVar1) && (bVar1 = WriteEbmlElement(writer,0x7671,(long)this->type_), bVar1)) &&
      ((this->private_data_length_ == 0 ||
       ((this->private_data_ == (uint8 *)0x0 ||
        (bVar1 = WriteEbmlElement(writer,0x7672,this->private_data_,this->private_data_length_),
        bVar1)))))) &&
     ((bVar1 = WriteEbmlElement(writer,0x7673,this->pose_yaw_), bVar1 &&
      (bVar1 = WriteEbmlElement(writer,0x7674,this->pose_pitch_), bVar1)))) {
    bVar1 = WriteEbmlElement(writer,0x7675,this->pose_roll_);
    return bVar1;
  }
  return false;
}

Assistant:

bool Projection::Write(IMkvWriter* writer) const {
  const uint64_t size = PayloadSize();

  // Don't write an empty element.
  if (size == 0)
    return true;

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvProjection, size))
    return false;

  if (!WriteEbmlElement(writer, libwebm::kMkvProjectionType,
                        static_cast<uint64>(type_))) {
    return false;
  }

  if (private_data_length_ > 0 && private_data_ != NULL &&
      !WriteEbmlElement(writer, libwebm::kMkvProjectionPrivate, private_data_,
                        private_data_length_)) {
    return false;
  }

  if (!WriteEbmlElement(writer, libwebm::kMkvProjectionPoseYaw, pose_yaw_))
    return false;

  if (!WriteEbmlElement(writer, libwebm::kMkvProjectionPosePitch,
                        pose_pitch_)) {
    return false;
  }

  if (!WriteEbmlElement(writer, libwebm::kMkvProjectionPoseRoll, pose_roll_)) {
    return false;
  }

  return true;
}